

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O3

bool __thiscall
HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::erase
          (HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
           *this,KeyType *key)

{
  _Head_base<0UL,_HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>_*,_false>
  _Var1;
  uchar *puVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  u8 meta;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  u8 local_29;
  ulong local_28;
  u64 local_20;
  u64 local_18;
  
  bVar3 = findPosition(this,key,&local_29,&local_18,&local_20,&local_28);
  if (bVar3) {
    _Var1._M_head_impl =
         (this->entries)._M_t.
         super___uniq_ptr_impl<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
         ._M_t.
         super__Tuple_impl<0UL,_HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>_*,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
         .
         super__Head_base<0UL,_HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>_*,_false>
         ._M_head_impl;
    (this->metadata)._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl[local_28] = '\0';
    uVar4 = this->numElements - 1;
    this->numElements = uVar4;
    uVar5 = this->tableSizeMask + 1;
    if (uVar5 == 0x80 || uVar5 >> 2 <= uVar4) {
      uVar5 = local_28 + 1 & this->tableSizeMask;
      bVar6 = (this->metadata)._M_t.
              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl[uVar5];
      while ((uVar4 = uVar5, (char)bVar6 < '\0' && (((int)uVar4 - (uint)bVar6 & 0x7f) != 0))) {
        _Var1._M_head_impl[local_28].key_ = _Var1._M_head_impl[uVar4].key_;
        *(int *)((long)(_Var1._M_head_impl + local_28) + 8) =
             *(int *)((long)(_Var1._M_head_impl + uVar4) + 8);
        puVar2 = (this->metadata)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        puVar2[local_28] = puVar2[uVar4];
        (this->metadata)._M_t.
        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl[uVar4] = '\0';
        uVar5 = uVar4 + 1 & this->tableSizeMask;
        bVar6 = (this->metadata)._M_t.
                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl[uVar5];
        local_28 = uVar4;
      }
    }
    else {
      shrinkTable(this);
    }
  }
  return bVar3;
}

Assistant:

bool erase(const KeyType& key) {
    u64 pos, startPos, maxPos;
    u8 meta;
    if (!findPosition(key, meta, startPos, maxPos, pos)) return false;
    // delete element at position pos
    Entry* entryArray = entries.get();
    entryArray[pos].~Entry();
    metadata[pos] = 0;

    // retain at least a quarter of slots occupied, otherwise shrink the table
    // if its not at its minimum size already
    --numElements;
    u64 capacity = tableSizeMask + 1;
    if (capacity != 128 && numElements < capacity / 4) {
      shrinkTable();
      return true;
    }

    // shift elements after pos backwards
    while (true) {
      u64 shift = (pos + 1) & tableSizeMask;
      if (!occupied(metadata[shift])) return true;

      u64 dist = distanceFromIdealSlot(shift);
      if (dist == 0) return true;

      entryArray[pos] = std::move(entryArray[shift]);
      metadata[pos] = metadata[shift];
      metadata[shift] = 0;
      pos = shift;
    }
  }